

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall
flatbuffers::ServiceDef::Deserialize(ServiceDef *this,Parser *parser,Service *service)

{
  Service *pSVar1;
  bool bVar2;
  uint uVar3;
  String *this_00;
  Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *pVVar4;
  RPCCall *this_01;
  return_type call_00;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  RPCCall *call;
  uoffset_t i;
  string local_68;
  string local_48;
  Service *local_28;
  Service *service_local;
  Parser *parser_local;
  ServiceDef *this_local;
  
  local_28 = service;
  service_local = (Service *)parser;
  parser_local = (Parser *)this;
  this_00 = reflection::Service::name(service);
  String::str_abi_cxx11_(&local_68,this_00);
  Parser::UnqualifiedName(&local_48,parser,&local_68);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  pVVar4 = reflection::Service::calls(local_28);
  if (pVVar4 != (Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *)0x0) {
    call._0_4_ = 0;
    while( true ) {
      pVVar4 = reflection::Service::calls(local_28);
      uVar3 = Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>::size(pVVar4);
      if (uVar3 <= (uint)call) break;
      this_01 = (RPCCall *)operator_new(0xd8);
      (this_01->super_Definition).declaration_file = (string *)0x0;
      this_01->request = (StructDef *)0x0;
      (this_01->super_Definition).serialized_location = 0;
      (this_01->super_Definition).index = 0;
      *(undefined8 *)&(this_01->super_Definition).refcount = 0;
      *(undefined8 *)&(this_01->super_Definition).generated = 0;
      (this_01->super_Definition).defined_namespace = (Namespace *)0x0;
      (this_01->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_01->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_01->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
      (this_01->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      *(_Base_ptr *)
       ((long)&(this_01->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_header + 0x10) = (_Base_ptr)0x0;
      *(_Base_ptr *)
       ((long)&(this_01->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_header + 0x18) = (_Base_ptr)0x0;
      *(undefined8 *)
       &(this_01->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header = 0
      ;
      *(_Base_ptr *)
       ((long)&(this_01->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_header + 8) = (_Base_ptr)0x0;
      (this_01->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined8 *)&(this_01->super_Definition).attributes.dict._M_t._M_impl = 0;
      (this_01->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_01->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_01->super_Definition).file.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(this_01->super_Definition).file.field_2 + 8) = 0;
      *(undefined8 *)&(this_01->super_Definition).file = 0;
      (this_01->super_Definition).file._M_string_length = 0;
      (this_01->super_Definition).name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(this_01->super_Definition).name.field_2 + 8) = 0;
      *(undefined8 *)&(this_01->super_Definition).name = 0;
      (this_01->super_Definition).name._M_string_length = 0;
      this_01->response = (StructDef *)0x0;
      RPCCall::RPCCall(this_01);
      pSVar1 = service_local;
      pVVar4 = reflection::Service::calls(local_28);
      call_00 = Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>::Get
                          (pVVar4,(uint)call);
      bVar2 = RPCCall::Deserialize(this_01,(Parser *)pSVar1,call_00);
      if ((!bVar2) ||
         (bVar2 = SymbolTable<flatbuffers::RPCCall>::Add(&this->calls,(string *)this_01,this_01),
         bVar2)) {
        if (this_01 != (RPCCall *)0x0) {
          RPCCall::~RPCCall(this_01);
          operator_delete(this_01,0xd8);
        }
        return false;
      }
      call._0_4_ = (uint)call + 1;
    }
  }
  pSVar1 = service_local;
  attrs = reflection::Service::attributes(local_28);
  bVar2 = Definition::DeserializeAttributes(&this->super_Definition,(Parser *)pSVar1,attrs);
  if (bVar2) {
    documentation = reflection::Service::documentation(local_28);
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
  }
  return bVar2;
}

Assistant:

bool ServiceDef::Deserialize(Parser &parser,
                             const reflection::Service *service) {
  name = parser.UnqualifiedName(service->name()->str());
  if (service->calls()) {
    for (uoffset_t i = 0; i < service->calls()->size(); ++i) {
      auto call = new RPCCall();
      if (!call->Deserialize(parser, service->calls()->Get(i)) ||
          calls.Add(call->name, call)) {
        delete call;
        return false;
      }
    }
  }
  if (!DeserializeAttributes(parser, service->attributes())) return false;
  DeserializeDoc(doc_comment, service->documentation());
  return true;
}